

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * get_next_arg(string *__return_storage_ptr__,int *i,int argc,char **argv,string *flag,
                     gpt_params *params)

{
  char *__s;
  int iVar1;
  FILE *pFVar2;
  allocator<char> local_19;
  
  iVar1 = *i + 1;
  if ((iVar1 < argc) && (__s = argv[(long)*i + 1], *__s != '-')) {
    *i = iVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_19);
    return __return_storage_ptr__;
  }
  pFVar2 = _stderr;
  fprintf(_stderr,"error: %s requires one argument.\n",(flag->_M_dataplus)._M_p);
  gpt_print_usage((int)pFVar2,argv,params);
  exit(0);
}

Assistant:

static std::string get_next_arg(int& i, int argc, char** argv, const std::string& flag, gpt_params& params) {
    if (i + 1 < argc && argv[i + 1][0] != '-') {
        return argv[++i];
    } else {
        fprintf(stderr, "error: %s requires one argument.\n", flag.c_str());
        gpt_print_usage(argc, argv, params);
        exit(0);
    }
}